

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_header.hpp
# Opt level: O0

void __thiscall
ELFIO::elf_header_impl<ELFIO::Elf64_Ehdr>::elf_header_impl
          (elf_header_impl<ELFIO::Elf64_Ehdr> *this,endianness_convertor *convertor,uchar encoding,
          address_translator *translator)

{
  uint16_t uVar1;
  uint32_t uVar2;
  address_translator *translator_local;
  uchar encoding_local;
  endianness_convertor *convertor_local;
  elf_header_impl<ELFIO::Elf64_Ehdr> *this_local;
  
  elf_header::elf_header(&this->super_elf_header);
  (this->super_elf_header)._vptr_elf_header = (_func_int **)&PTR__elf_header_impl_001242c8;
  (this->header).e_ident[0] = '\0';
  (this->header).e_ident[1] = '\0';
  (this->header).e_ident[2] = '\0';
  (this->header).e_ident[3] = '\0';
  (this->header).e_ident[4] = '\0';
  (this->header).e_ident[5] = '\0';
  (this->header).e_ident[6] = '\0';
  (this->header).e_ident[7] = '\0';
  (this->header).e_ident[8] = '\0';
  (this->header).e_ident[9] = '\0';
  (this->header).e_ident[10] = '\0';
  (this->header).e_ident[0xb] = '\0';
  (this->header).e_ident[0xc] = '\0';
  (this->header).e_ident[0xd] = '\0';
  (this->header).e_ident[0xe] = '\0';
  (this->header).e_ident[0xf] = '\0';
  (this->header).e_type = 0;
  (this->header).e_machine = 0;
  (this->header).e_version = 0;
  (this->header).e_entry = 0;
  (this->header).e_phoff = 0;
  (this->header).e_shoff = 0;
  (this->header).e_flags = 0;
  (this->header).e_ehsize = 0;
  (this->header).e_phentsize = 0;
  (this->header).e_phnum = 0;
  (this->header).e_shentsize = 0;
  (this->header).e_shnum = 0;
  (this->header).e_shstrndx = 0;
  this->convertor = convertor;
  this->translator = translator;
  (this->header).e_ident[0] = '\x7f';
  (this->header).e_ident[1] = 'E';
  (this->header).e_ident[2] = 'L';
  (this->header).e_ident[3] = 'F';
  (this->header).e_ident[4] = '\x02';
  (this->header).e_ident[5] = encoding;
  (this->header).e_ident[6] = '\x01';
  uVar2 = endianness_convertor::operator()(convertor,1);
  (this->header).e_version = uVar2;
  (this->header).e_ehsize = 0x40;
  uVar1 = endianness_convertor::operator()(convertor,(this->header).e_ehsize);
  (this->header).e_ehsize = uVar1;
  uVar1 = endianness_convertor::operator()(convertor,1);
  (this->header).e_shstrndx = uVar1;
  (this->header).e_phentsize = 0x38;
  (this->header).e_shentsize = 0x40;
  uVar1 = endianness_convertor::operator()(convertor,(this->header).e_phentsize);
  (this->header).e_phentsize = uVar1;
  uVar1 = endianness_convertor::operator()(convertor,(this->header).e_shentsize);
  (this->header).e_shentsize = uVar1;
  return;
}

Assistant:

elf_header_impl( endianness_convertor*     convertor,
                     unsigned char             encoding,
                     const address_translator* translator )
        : convertor( convertor ), translator( translator )
    {
        header.e_ident[EI_MAG0]    = ELFMAG0;
        header.e_ident[EI_MAG1]    = ELFMAG1;
        header.e_ident[EI_MAG2]    = ELFMAG2;
        header.e_ident[EI_MAG3]    = ELFMAG3;
        header.e_ident[EI_CLASS]   = elf_header_impl_types<T>::file_class;
        header.e_ident[EI_DATA]    = encoding;
        header.e_ident[EI_VERSION] = EV_CURRENT;
        header.e_version           = ( *convertor )( (Elf_Word)EV_CURRENT );
        header.e_ehsize            = ( sizeof( header ) );
        header.e_ehsize            = ( *convertor )( header.e_ehsize );
        header.e_shstrndx          = ( *convertor )( (Elf_Half)1 );
        header.e_phentsize =
            sizeof( typename elf_header_impl_types<T>::Phdr_type );
        header.e_shentsize =
            sizeof( typename elf_header_impl_types<T>::Shdr_type );
        header.e_phentsize = ( *convertor )( header.e_phentsize );
        header.e_shentsize = ( *convertor )( header.e_shentsize );
    }